

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall
Client::Client(Client *this,Server *server,Client *client,Address *clientAddr,ICallback *callback,
              Settings *settings)

{
  Settings *settings_local;
  ICallback *callback_local;
  Address *clientAddr_local;
  Client *client_local;
  Server *server_local;
  Client *this_local;
  
  Server::Client::ICallback::ICallback(&this->super_ICallback);
  DirectLine::ICallback::ICallback(&this->super_ICallback);
  ProxyLine::ICallback::ICallback(&this->super_ICallback);
  (this->super_ICallback)._vptr_ICallback = (_func_int **)&PTR_onRead_00137980;
  (this->super_ICallback)._vptr_ICallback = (_func_int **)&DAT_001379c8;
  (this->super_ICallback)._vptr_ICallback = (_func_int **)&DAT_001379e8;
  this->_server = server;
  this->_handle = client;
  this->_callback = callback;
  this->_settings = settings;
  this->_proxyLine = (ProxyLine *)0x0;
  this->_directLine = (DirectLine *)0x0;
  this->_activeLine = (Client *)0x0;
  this->_address = *clientAddr;
  Address::Address(&this->_destination);
  String::String(&this->_destinationHostname);
  this->_lastReadActivity = 0;
  return;
}

Assistant:

Client::Client(Server& server, Server::Client& client, const Address& clientAddr, ICallback& callback, Settings& settings)
    : _server(server)
    , _handle(client)
    , _callback(callback)
    , _settings(settings)
    , _proxyLine(nullptr)
    , _directLine(nullptr)
    , _activeLine(nullptr)
    , _address(clientAddr)
    , _lastReadActivity(0)
{
    ;
}